

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix
          (cmGlobalNinjaGenerator *this,string *path)

{
  string_view suffix;
  ulong uVar1;
  string *path_local;
  cmGlobalNinjaGenerator *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    EnsureTrailingSlash(path);
    suffix = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)&this->OutputPathPrefix);
    cmStripSuffixIfExists(path,suffix);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix(
  std::string& path)
{
  if (path.empty()) {
    return;
  }
  EnsureTrailingSlash(path);
  cmStripSuffixIfExists(path, this->OutputPathPrefix);
}